

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

int __thiscall asmjit::Zone::dup(Zone *this,int __fd)

{
  ulong size;
  byte in_CL;
  size_t in_RDX;
  undefined4 in_register_00000034;
  uint8_t *m;
  size_t remainingBytes;
  uint8_t *ptr;
  char *in_stack_00000370;
  int in_stack_0000037c;
  char *in_stack_00000380;
  int local_40;
  uint8_t *local_8;
  
  if ((void *)CONCAT44(in_register_00000034,__fd) == (void *)0x0 || in_RDX == 0) {
    local_40 = 0;
  }
  else {
    if (in_RDX == 0xffffffffffffffff) {
      DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
    }
    size = in_RDX + (in_CL & 1);
    local_8 = this->_ptr;
    if ((ulong)((long)this->_end - (long)local_8) < size) {
      local_8 = (uint8_t *)_alloc(this,size);
    }
    else {
      this->_ptr = this->_ptr + size;
      if (this->_end < this->_ptr) {
        DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
      }
    }
    if (local_8 == (uint8_t *)0x0) {
      local_40 = 0;
    }
    else {
      memcpy(local_8,(void *)CONCAT44(in_register_00000034,__fd),in_RDX);
      if ((in_CL & 1) != 0) {
        local_8[in_RDX] = '\0';
      }
      local_40 = (int)local_8;
    }
  }
  return local_40;
}

Assistant:

void* Zone::dup(const void* data, size_t size, bool nullTerminate) noexcept {
  if (ASMJIT_UNLIKELY(!data || !size)) return nullptr;

  ASMJIT_ASSERT(size != IntTraits<size_t>::maxValue());
  uint8_t* m = allocT<uint8_t>(size + nullTerminate);
  if (ASMJIT_UNLIKELY(!m)) return nullptr;

  ::memcpy(m, data, size);
  if (nullTerminate) m[size] = '\0';

  return static_cast<void*>(m);
}